

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex.h
# Opt level: O1

void __thiscall
rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Patch
          (GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *this,SizeType l,SizeType s)

{
  uint uVar1;
  char *pcVar2;
  ulong uVar3;
  
  if (l != 0xffffffff) {
    uVar1 = this->stateCount_;
    pcVar2 = (this->states_).stack_;
    do {
      if (uVar1 <= l) {
        __assert_fail("index < stateCount_",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/internal/regex.h"
                      ,0xaa,
                      "State &rapidjson::internal::GenericRegex<rapidjson::UTF8<>>::GetState(SizeType) [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::CrtAllocator]"
                     );
      }
      uVar3 = (ulong)l;
      l = *(SizeType *)(pcVar2 + uVar3 * 0x10);
      *(SizeType *)(pcVar2 + uVar3 * 0x10) = s;
    } while (l != 0xffffffff);
  }
  return;
}

Assistant:

void Patch(SizeType l, SizeType s) {
        for (SizeType next; l != kRegexInvalidState; l = next) {
            next = GetState(l).out;
            GetState(l).out = s;
        }
    }